

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,ListOfStatements *list_of_statements)

{
  pointer this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppSVar4;
  SubtreeWrapper *pSVar5;
  undefined4 extraout_var;
  reference ppSVar6;
  SeqStatement *this_01;
  StatementWrapper *this_02;
  int local_84;
  SeqStatement *pSStack_80;
  int i;
  Statement *suffix;
  SubtreeWrapper *local_60;
  SubtreeWrapper *ir_statement;
  Statement **statement;
  iterator __end3;
  iterator __begin3;
  vector<Statement_*,_std::allocator<Statement_*>_> *__range3;
  vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> ir_statements;
  vector<Statement_*,_std::allocator<Statement_*>_> *statements;
  ListOfStatements *list_of_statements_local;
  IRTreeBuildVisitor *this_local;
  
  ir_statements.super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&list_of_statements->list_of_statements_;
  bVar1 = std::vector<Statement_*,_std::allocator<Statement_*>_>::empty
                    ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                     ir_statements.
                     super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)0x0;
  }
  else {
    sVar3 = std::vector<Statement_*,_std::allocator<Statement_*>_>::size
                      ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                       ir_statements.
                       super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar3 == 1) {
      ppSVar4 = std::vector<Statement_*,_std::allocator<Statement_*>_>::operator[]
                          ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                           ir_statements.
                           super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &(*ppSVar4)->super_Node);
      (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = pSVar5;
    }
    else {
      std::vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>::vector
                ((vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> *)&__range3);
      this_00 = ir_statements.
                super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      __end3 = std::vector<Statement_*,_std::allocator<Statement_*>_>::begin
                         ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                          ir_statements.
                          super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      statement = (Statement **)
                  std::vector<Statement_*,_std::allocator<Statement_*>_>::end
                            ((vector<Statement_*,_std::allocator<Statement_*>_> *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>
                                         *)&statement), bVar1) {
        ir_statement = (SubtreeWrapper *)
                       __gnu_cxx::
                       __normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>
                       ::operator*(&__end3);
        local_60 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                             (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                              (Node *)ir_statement->_vptr_SubtreeWrapper);
        if (local_60 != (SubtreeWrapper *)0x0) {
          iVar2 = (*local_60->_vptr_SubtreeWrapper[3])();
          suffix = (Statement *)CONCAT44(extraout_var,iVar2);
          std::vector<IRT::Statement*,std::allocator<IRT::Statement*>>::
          emplace_back<IRT::Statement*>
                    ((vector<IRT::Statement*,std::allocator<IRT::Statement*>> *)&__range3,&suffix);
        }
        __gnu_cxx::
        __normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>::
        operator++(&__end3);
      }
      ppSVar6 = std::vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>::back
                          ((vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> *)&__range3)
      ;
      pSStack_80 = (SeqStatement *)*ppSVar6;
      sVar3 = std::vector<Statement_*,_std::allocator<Statement_*>_>::size
                        ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                         ir_statements.
                         super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      for (local_84 = (int)sVar3 + -2; -1 < local_84; local_84 = local_84 + -1) {
        this_01 = (SeqStatement *)operator_new(0x18);
        ppSVar6 = std::vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>::operator[]
                            ((vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> *)
                             &__range3,(long)local_84);
        IRT::SeqStatement::SeqStatement(this_01,*ppSVar6,&pSStack_80->super_Statement);
        pSStack_80 = this_01;
      }
      this_02 = (StatementWrapper *)operator_new(0x10);
      IRT::StatementWrapper::StatementWrapper(this_02,&pSStack_80->super_Statement);
      (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_02;
      std::vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>::~vector
                ((vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> *)&__range3);
    }
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(ListOfStatements* list_of_statements) {
  auto& statements = list_of_statements->list_of_statements_;
  if (statements.empty()) {
    tos_value_ = nullptr;
  } else if (statements.size() == 1) {
    tos_value_ = Accept(statements[0]);
  } else {
    std::vector<IRT::Statement*> ir_statements;
    for (auto&& statement : statements) {
      auto ir_statement = Accept(statement);
      if (ir_statement) {
        ir_statements.emplace_back(ir_statement->ToStatement());
      }
    }

    IRT::Statement* suffix = ir_statements.back();
    for (int i = static_cast<int>(statements.size()) - 2; i >= 0; --i) {
      suffix = new IRT::SeqStatement(ir_statements[i], suffix);
    }

    tos_value_ = new IRT::StatementWrapper(suffix);
  }
}